

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTransport.h
# Opt level: O3

void __thiscall
duckdb_apache::thrift::transport::TTransport::consume_virt(TTransport *this,uint32_t param_1)

{
  TException *this_00;
  undefined4 in_register_00000034;
  string local_40;
  
  this_00 = (TException *)__cxa_allocate_exception(0x30,CONCAT44(in_register_00000034,param_1));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Base TTransport cannot consume.","");
  TException::TException(this_00,&local_40);
  *(undefined ***)this_00 = &PTR__TException_0049e3c8;
  *(undefined4 *)(this_00 + 1) = 1;
  __cxa_throw(this_00,&TTransportException::typeinfo,TException::~TException);
}

Assistant:

virtual void consume_virt(uint32_t /* len */) {
    throw TTransportException(TTransportException::NOT_OPEN, "Base TTransport cannot consume.");
  }